

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeltype.h
# Opt level: O2

int MElementType_NNodes(MElementType elType)

{
  if (elType < EPolygonal) {
    return *(int *)(&DAT_01305938 + (ulong)elType * 4);
  }
  std::operator<<((ostream *)&std::cout,"ElementType not found!");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Common/pzeltype.h",
             0x77);
}

Assistant:

inline int MElementType_NNodes(MElementType elType)
{
	switch(elType)
	{
        case(0)://point
        {
            return 1;
        }
		case(1)://line
		{
			return 2;
		}
		case(2)://triangle
		{
			return 3;
		}
		case(3)://quadrilateral
		{
			return 4;
		}
		case(4)://tetraedron
		{
			return 4;
		}
		case(5)://pyramid
		{
			return 5;
		}
		case(6)://prism
		{
			return 6;
		}
		case(7)://cube
		{
			return 8;
		}
		default:
		{
			std::cout << "ElementType not found!";
			DebugStop();
		}
	}
	DebugStop();
	return -1;
}